

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

void __thiscall
helics::CoreBroker::processDisconnectCommand(CoreBroker *this,ActionMessage *command)

{
  action_t aVar1;
  GlobalFederateId fedid;
  _func_int *UNRECOVERED_JUMPTABLE;
  route_id rVar2;
  BasicBrokerInfo *brk;
  
  brk = getBrokerById(this,(GlobalBrokerId)(command->source_id).gid);
  aVar1 = command->messageAction;
  if ((uint)(aVar1 + (cmd_route_ack|cmd_disconnect_core)) < 2) {
    if (brk != (BasicBrokerInfo *)0x0) {
      disconnectBroker(this,brk);
      if ((this->super_BrokerBase).field_0x294 == '\0') {
        (*(this->super_Broker)._vptr_Broker[0x22])(this,0,command);
        return;
      }
    }
  }
  else if ((aVar1 == cmd_disconnect) || (aVar1 == cmd_priority_disconnect)) {
    fedid.gid = (command->dest_id).gid;
    if (fedid.gid == (this->super_BrokerBase).global_broker_id_local.gid) {
      disconnectTiming(this,command);
      return;
    }
    if (fedid.gid != 0) {
      if (fedid.gid == (this->mTimeMonitorLocalFederateId).gid) {
        processTimeMonitorMessage(this,command);
        return;
      }
      rVar2 = getRoute(this,fedid);
      UNRECOVERED_JUMPTABLE = (this->super_Broker)._vptr_Broker[0x22];
      (*UNRECOVERED_JUMPTABLE)(this,(ulong)(uint)rVar2.rid,command,UNRECOVERED_JUMPTABLE);
      return;
    }
    processBrokerDisconnect(this,command,brk);
    return;
  }
  return;
}

Assistant:

void CoreBroker::processDisconnectCommand(ActionMessage& command)
{
    auto* brk = getBrokerById(GlobalBrokerId{command.source_id});
    switch (command.action()) {
        case CMD_DISCONNECT:
        case CMD_PRIORITY_DISCONNECT:
            if (command.dest_id == global_broker_id_local) {
                // deal with the time implications of the message
                disconnectTiming(command);
            } else if (command.dest_id == parent_broker_id) {
                processBrokerDisconnect(command, brk);
            } else if (command.dest_id == mTimeMonitorLocalFederateId) {
                processTimeMonitorMessage(command);
            } else {
                transmit(getRoute(command.dest_id), command);
            }
            break;
        case CMD_DISCONNECT_CORE:
        case CMD_DISCONNECT_BROKER:
            if (brk != nullptr) {
                disconnectBroker(*brk);
                if (!isRootc) {
                    transmit(parent_route_id, command);
                }
            }
            break;
        default:
            break;
    }
}